

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O2

FT_ULong ft_lzwstate_io(FT_LzwState state,FT_Byte *buffer,FT_ULong out_size)

{
  FT_Byte FVar1;
  FT_LzwPhase FVar2;
  FT_ULong FVar3;
  FT_Error FVar4;
  FT_UInt FVar5;
  int iVar6;
  FT_ULong FVar7;
  ulong uVar8;
  FT_UShort *pFVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  FT_Byte max_bits;
  undefined8 local_50;
  FT_ULong local_48;
  int local_3c;
  FT_Byte *local_38;
  
  uVar15 = state->old_code;
  uVar14 = state->old_char;
  uVar13 = state->in_code;
  if (out_size == 0) {
    local_48 = 0;
    goto LAB_0017f892;
  }
  FVar2 = state->phase;
  local_48 = 0;
  FVar7 = local_48;
  FVar3 = out_size;
  local_38 = buffer;
  if (FVar2 == FT_LZW_PHASE_STACK) goto LAB_0017f864;
  if (FVar2 == FT_LZW_PHASE_CODE) {
    local_50 = CONCAT44(local_50._4_4_,uVar13);
    local_48 = out_size;
LAB_0017f73f:
    do {
      uVar13 = ft_lzwstate_get_code(state);
      if ((int)uVar13 < 0) goto LAB_0017f76d;
      uVar11 = uVar13;
      if (uVar13 == 0x100) {
        if (state->block_mode != 0) {
          state->free_ent = 0;
          state->buf_clear = '\x01';
          uVar15 = 0;
          uVar14 = 0;
          goto LAB_0017f73f;
        }
LAB_0017f785:
        if (state->free_ent <= uVar13 - 0x100) {
          if (state->free_ent < uVar13 - 0x100) goto LAB_0017f771;
          uVar11 = state->stack_top;
          uVar8 = (ulong)uVar11;
          if (state->stack_size <= uVar8) {
            iVar6 = ft_lzwstate_stack_grow(state);
            if (iVar6 < 0) goto LAB_0017f771;
            uVar11 = state->stack_top;
            uVar8 = (ulong)uVar11;
          }
          state->stack_top = uVar11 + 1;
          state->stack[uVar8] = (FT_Byte)uVar14;
          uVar11 = uVar15;
        }
        for (; 0xff < uVar11; uVar11 = (uint)state->prefix[uVar11 - 0x100]) {
          if (state->prefix == (FT_UShort *)0x0) goto LAB_0017f771;
          uVar12 = state->stack_top;
          uVar8 = (ulong)uVar12;
          if (state->stack_size <= uVar8) {
            iVar6 = ft_lzwstate_stack_grow(state);
            if (iVar6 < 0) goto LAB_0017f771;
            uVar12 = state->stack_top;
            uVar8 = (ulong)uVar12;
          }
          FVar1 = state->suffix[uVar11 - 0x100];
          state->stack_top = uVar12 + 1;
          state->stack[uVar8] = FVar1;
        }
      }
      else if (0xff < uVar13) goto LAB_0017f785;
      uVar14 = uVar11;
      buffer = local_38;
      uVar11 = state->stack_top;
      uVar8 = (ulong)uVar11;
      if (state->stack_size <= uVar8) {
        iVar6 = ft_lzwstate_stack_grow(state);
        if (iVar6 < 0) goto LAB_0017f771;
        uVar11 = state->stack_top;
        uVar8 = (ulong)uVar11;
      }
      state->stack_top = uVar11 + 1;
      state->stack[uVar8] = (FT_Byte)uVar14;
      state->phase = FT_LZW_PHASE_STACK;
      FVar3 = local_48;
LAB_0017f864:
      while( true ) {
        local_48 = FVar3;
        if (state->stack_top == 0) break;
        uVar11 = state->stack_top - 1;
        state->stack_top = uVar11;
        if (buffer != (FT_Byte *)0x0) {
          buffer[FVar7] = state->stack[uVar11];
        }
        FVar7 = FVar7 + 1;
        FVar3 = local_48;
        if (local_48 == FVar7) goto LAB_0017f892;
      }
      uVar11 = state->free_ent;
      if (uVar11 < state->max_free) {
        uVar12 = state->prefix_size;
        uVar8 = (ulong)uVar12;
        if (uVar12 <= uVar11) {
          local_50 = 0x200;
          if (uVar8 != 0) {
            local_50 = (ulong)((uVar12 >> 2) + uVar12);
          }
          pFVar9 = (FT_UShort *)
                   ft_mem_realloc(state->memory,3,uVar8,local_50,state->prefix,&local_3c);
          state->prefix = pFVar9;
          if (local_3c != 0) goto LAB_0017f771;
          state->suffix = (FT_Byte *)(pFVar9 + local_50);
          memmove(pFVar9 + local_50,pFVar9 + uVar8,uVar8);
          state->prefix_size = (FT_UInt)local_50;
          uVar11 = state->free_ent;
        }
        state->prefix[uVar11] = (FT_UShort)uVar15;
        state->suffix[uVar11] = (FT_Byte)uVar14;
        state->free_ent = state->free_ent + 1;
      }
      state->phase = FT_LZW_PHASE_CODE;
      local_50 = CONCAT44(local_50._4_4_,uVar13);
      uVar15 = uVar13;
    } while( true );
  }
  if (FVar2 != FT_LZW_PHASE_START) goto LAB_0017f892;
  local_48 = out_size;
  FVar4 = FT_Stream_Seek(state->source,2);
  if (FVar4 == 0) {
    FVar7 = FT_Stream_TryRead(state->source,&max_bits,1);
    if (FVar7 == 1) {
      uVar11 = max_bits & 0x1f;
      state->max_bits = uVar11;
      bVar10 = (byte)uVar11;
      state->block_mode = max_bits & 0xffffff80;
      state->max_free = (1 << bVar10) - 0x100;
      if (bVar10 < 0x11) {
        state->num_bits = 9;
        state->free_ent = (uint)(max_bits >> 7);
        FVar5 = 0x100;
        if (bVar10 < 10) {
          FVar5 = (1 << bVar10) - 0xff;
        }
        state->free_bits = FVar5;
        uVar11 = ft_lzwstate_get_code(state);
        uVar13 = 0;
        if (uVar11 < 0x100) {
          if (local_38 != (FT_Byte *)0x0) {
            *local_38 = (FT_Byte)uVar11;
          }
          uVar15 = uVar11;
          uVar14 = uVar11;
          if (local_48 != 1) {
            state->phase = FT_LZW_PHASE_CODE;
            local_50 = (ulong)local_50._4_4_ << 0x20;
            FVar7 = 1;
            goto LAB_0017f73f;
          }
          local_48 = 1;
          uVar13 = 0;
          goto LAB_0017f892;
        }
      }
    }
  }
  FVar7 = 0;
  goto LAB_0017f771;
LAB_0017f76d:
  uVar13 = (uint)local_50;
LAB_0017f771:
  local_48 = FVar7;
  state->phase = FT_LZW_PHASE_EOF;
LAB_0017f892:
  state->old_code = uVar15;
  state->old_char = uVar14;
  state->in_code = uVar13;
  return local_48;
}

Assistant:

FT_LOCAL_DEF( FT_ULong )
  ft_lzwstate_io( FT_LzwState  state,
                  FT_Byte*     buffer,
                  FT_ULong     out_size )
  {
    FT_ULong  result = 0;

    FT_UInt  old_char = state->old_char;
    FT_UInt  old_code = state->old_code;
    FT_UInt  in_code  = state->in_code;


    if ( out_size == 0 )
      goto Exit;

    switch ( state->phase )
    {
    case FT_LZW_PHASE_START:
      {
        FT_Byte   max_bits;
        FT_Int32  c;


        /* skip magic bytes, and read max_bits + block_flag */
        if ( FT_Stream_Seek( state->source, 2 ) != 0               ||
             FT_Stream_TryRead( state->source, &max_bits, 1 ) != 1 )
          goto Eof;

        state->max_bits   = max_bits & LZW_BIT_MASK;
        state->block_mode = max_bits & LZW_BLOCK_MASK;
        state->max_free   = (FT_UInt)( ( 1UL << state->max_bits ) - 256 );

        if ( state->max_bits > LZW_MAX_BITS )
          goto Eof;

        state->num_bits = LZW_INIT_BITS;
        state->free_ent = ( state->block_mode ? LZW_FIRST
                                              : LZW_CLEAR ) - 256;
        in_code  = 0;

        state->free_bits = state->num_bits < state->max_bits
                           ? (FT_UInt)( ( 1UL << state->num_bits ) - 256 )
                           : state->max_free + 1;

        c = ft_lzwstate_get_code( state );
        if ( c < 0 || c > 255 )
          goto Eof;

        old_code = old_char = (FT_UInt)c;

        if ( buffer )
          buffer[result] = (FT_Byte)old_char;

        if ( ++result >= out_size )
          goto Exit;

        state->phase = FT_LZW_PHASE_CODE;
      }
      /* fall-through */

    case FT_LZW_PHASE_CODE:
      {
        FT_Int32  c;
        FT_UInt   code;


      NextCode:
        c = ft_lzwstate_get_code( state );
        if ( c < 0 )
          goto Eof;

        code = (FT_UInt)c;

        if ( code == LZW_CLEAR && state->block_mode )
        {
          /* why not LZW_FIRST-256 ? */
          state->free_ent  = ( LZW_FIRST - 1 ) - 256;
          state->buf_clear = 1;

          /* not quite right, but at least more predictable */
          old_code = 0;
          old_char = 0;

          goto NextCode;
        }

        in_code = code; /* save code for later */

        if ( code >= 256U )
        {
          /* special case for KwKwKwK */
          if ( code - 256U >= state->free_ent )
          {
            /* corrupted LZW stream */
            if ( code - 256U > state->free_ent )
              goto Eof;

            FTLZW_STACK_PUSH( old_char );
            code = old_code;
          }

          while ( code >= 256U )
          {
            if ( !state->prefix )
              goto Eof;

            FTLZW_STACK_PUSH( state->suffix[code - 256] );
            code = state->prefix[code - 256];
          }
        }

        old_char = code;
        FTLZW_STACK_PUSH( old_char );

        state->phase = FT_LZW_PHASE_STACK;
      }
      /* fall-through */

    case FT_LZW_PHASE_STACK:
      {
        while ( state->stack_top > 0 )
        {
          state->stack_top--;

          if ( buffer )
            buffer[result] = state->stack[state->stack_top];

          if ( ++result == out_size )
            goto Exit;
        }

        /* now create new entry */
        if ( state->free_ent < state->max_free )
        {
          if ( state->free_ent >= state->prefix_size &&
               ft_lzwstate_prefix_grow( state ) < 0  )
            goto Eof;

          FT_ASSERT( state->free_ent < state->prefix_size );

          state->prefix[state->free_ent] = (FT_UShort)old_code;
          state->suffix[state->free_ent] = (FT_Byte)  old_char;

          state->free_ent += 1;
        }

        old_code = in_code;

        state->phase = FT_LZW_PHASE_CODE;
        goto NextCode;
      }

    default:  /* state == EOF */
      ;
    }

  Exit:
    state->old_code = old_code;
    state->old_char = old_char;
    state->in_code  = in_code;

    return result;

  Eof:
    state->phase = FT_LZW_PHASE_EOF;
    goto Exit;
  }